

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

_Bool target_set_monster(monster *mon)

{
  _Bool _Var1;
  
  if ((mon == (monster *)0x0) || (_Var1 = target_able(mon), !_Var1)) {
    if (target_fixed != '\x01') {
      target_set = 0;
      target.grid.x = 0;
      target.grid.y = 0;
      target.midx = 0;
      return false;
    }
    target.midx = 0;
  }
  else {
    target_set = 1;
    target.midx = mon->midx;
    target.grid = mon->grid;
  }
  return true;
}

Assistant:

bool target_set_monster(struct monster *mon)
{
	/* Acceptable target */
	if (mon && target_able(mon)) {
		target_set = true;
		target.midx = mon->midx;
		target.grid = mon->grid;
		return true;
	} else if (target_fixed) {
		/* If a monster has died during a spell, this maintains its grid as
		 * the target in case further effects of the spell need it */
		target.midx = 0;
		return true;
	}

	/* Reset target info */
	target_set = false;
	target.midx = 0;
	target.grid.y = 0;
	target.grid.x = 0;

	return false;
}